

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O1

shared_ptr<WaterPool> __thiscall
cinject::InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_>::getInstance
          (InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_> *this,
          InjectionContext *context)

{
  pointer pcVar1;
  Container *pCVar2;
  pointer pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<WaterPool> sVar4;
  Container *local_28;
  pointer pcStack_20;
  
  if (*(char *)&(context->componentStack_).
                super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    sVar4 = createInstance(this,context);
    in_RDX = sVar4.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    if (context[1].container_ == (Container *)0x0) {
      sVar4 = createInstance((InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_> *)
                             &stack0xffffffffffffffd8,context);
      pcVar3 = pcStack_20;
      pCVar2 = local_28;
      in_RDX = sVar4.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_28 = (Container *)0x0;
      pcStack_20 = (pointer)0x0;
      pcVar1 = context[1].componentStack_.
               super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
               ._M_impl.super__Vector_impl_data._M_start;
      context[1].container_ = pCVar2;
      context[1].componentStack_.
      super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>._M_impl.
      super__Vector_impl_data._M_start = pcVar3;
      if (pcVar1 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1);
        in_RDX._M_pi = extraout_RDX;
      }
      if (pcStack_20 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcStack_20);
        in_RDX._M_pi = extraout_RDX_00;
      }
    }
    this->_vptr_InstanceStorage = (_func_int **)context[1].container_;
    pcVar1 = context[1].componentStack_.
             super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->factory_).instance_.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pcVar1;
    if (pcVar1 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(pcVar1->customName)._M_dataplus._M_p =
             *(int *)&(pcVar1->customName)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(pcVar1->customName)._M_dataplus._M_p =
             *(int *)&(pcVar1->customName)._M_dataplus._M_p + 1;
      }
    }
  }
  sVar4.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<WaterPool>)sVar4.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TImplementation> getInstance(InjectionContext* context)
    {
        if (!isSingleton_)
        {
            return createInstance(context);
        }

        if (instance_ == nullptr)
        {
            instance_ = createInstance(context);
        }

        return instance_;
    }